

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-partial-array.h
# Opt level: O3

int read_partial_array(coda_cursor_conflict *cursor,long offset,long length,void *dst)

{
  long lVar1;
  ushort *puVar2;
  ulong uVar3;
  coda_type_class cVar4;
  coda_backend cVar5;
  undefined4 uVar6;
  coda_dynamic_type_struct *pcVar7;
  long lVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [11];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  int iVar29;
  coda_dynamic_type_struct *pcVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  size_t __n;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  pcVar7 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar7[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0x128,"int read_partial_array(const coda_cursor *, long, long, void *)");
  }
  lVar35 = (long)*(int *)((long)&pcVar7[2].definition + 4);
  pcVar30 = *(coda_dynamic_type_struct **)(pcVar7 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar7 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar30 = pcVar7;
  }
  cVar4 = pcVar30->definition->type_class;
  lVar1 = length + offset;
  iVar29 = (int)(offset / lVar35);
  iVar34 = (int)(lVar1 / lVar35);
  if (iVar29 <= iVar34) {
    cVar5 = pcVar7[3].backend;
    iVar34 = (iVar34 - iVar29) + 1;
    lVar36 = 0;
    lVar31 = (long)iVar29;
    do {
      lVar8 = *(long *)(*(long *)(pcVar7 + 4) + lVar31 * 8);
      if (lVar8 < 0) {
        coda_set_error(-200,"Missing record not supported for CDF variable");
        return -1;
      }
      lVar33 = (long)*(int *)((long)&pcVar7[2].definition + 4);
      lVar32 = lVar31 * lVar33;
      __n = (int)cVar5 * lVar35;
      if (lVar1 < (lVar31 + 1) * lVar33) {
        __n = (long)(int)pcVar7[3].backend * (lVar1 - lVar32);
      }
      if (offset - lVar32 == 0 || offset < lVar32) {
        lVar32 = 0;
      }
      else {
        lVar32 = (offset - lVar32) * (long)(int)pcVar7[3].backend;
        __n = __n - lVar32;
      }
      if (pcVar7[4].definition == (coda_type *)0x0) {
        iVar29 = read_bytes((coda_product *)cursor->product[1].filename,lVar32 + lVar8,__n,
                            (void *)((long)dst + lVar36));
        if (iVar29 != 0) {
          return -1;
        }
      }
      else {
        memcpy((void *)((long)dst + lVar36),
               (void *)((long)&(pcVar7[4].definition)->format + lVar32 + lVar8),__n);
      }
      lVar36 = lVar36 + __n;
      iVar34 = iVar34 + -1;
      lVar31 = lVar31 + 1;
    } while (iVar34 != 0);
  }
  if ((cVar4 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
    switch(pcVar7[3].backend) {
    case coda_backend_binary:
      break;
    case 2:
      if (0 < length) {
        lVar35 = 0;
        do {
          puVar2 = (ushort *)((long)dst + lVar35 * 2);
          *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
          lVar35 = lVar35 + 1;
        } while (length != lVar35);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                    ,0x17b,"int read_partial_array(const coda_cursor *, long, long, void *)");
    case 4:
      if (0 < length) {
        lVar35 = 0;
        do {
          uVar6 = *(undefined4 *)((long)dst + lVar35 * 4);
          auVar37._8_8_ = 0;
          auVar37._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)
                                                  ((uint)uVar6 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar6 >> 0x10),uVar6)) >>
                                                  0x20),uVar6) >> 0x18),
                                               CONCAT12((char)((uint)uVar6 >> 8),(short)uVar6)) >>
                                     0x10),(short)uVar6) & 0xffff00ff00ff00ff;
          auVar38 = pshuflw(auVar37,auVar37,0x1b);
          sVar9 = auVar38._0_2_;
          sVar10 = auVar38._2_2_;
          sVar11 = auVar38._4_2_;
          sVar12 = auVar38._6_2_;
          *(uint *)((long)dst + lVar35 * 4) =
               CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar38[6] - (0xff < sVar12),
                        CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar38[4] - (0xff < sVar11),
                                 CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar38[2] -
                                          (0xff < sVar10),
                                          (0 < sVar9) * (sVar9 < 0x100) * auVar38[0] -
                                          (0xff < sVar9))));
          lVar35 = lVar35 + 1;
        } while (length != lVar35);
      }
      break;
    case 8:
      if (0 < length) {
        lVar35 = 0;
        do {
          uVar3 = *(ulong *)((long)dst + lVar35 * 8);
          auVar17._8_6_ = 0;
          auVar17._0_8_ = uVar3;
          auVar17[0xe] = (char)(uVar3 >> 0x38);
          auVar18._8_4_ = 0;
          auVar18._0_8_ = uVar3;
          auVar18[0xc] = (char)(uVar3 >> 0x30);
          auVar18._13_2_ = auVar17._13_2_;
          auVar19._8_4_ = 0;
          auVar19._0_8_ = uVar3;
          auVar19._12_3_ = auVar18._12_3_;
          auVar20._8_2_ = 0;
          auVar20._0_8_ = uVar3;
          auVar20[10] = (char)(uVar3 >> 0x28);
          auVar20._11_4_ = auVar19._11_4_;
          auVar21._8_2_ = 0;
          auVar21._0_8_ = uVar3;
          auVar21._10_5_ = auVar20._10_5_;
          auVar22[8] = (char)(uVar3 >> 0x20);
          auVar22._0_8_ = uVar3;
          auVar22._9_6_ = auVar21._9_6_;
          auVar38[7] = 0;
          auVar38._0_7_ = auVar22._8_7_;
          auVar25._7_8_ = 0;
          auVar25._0_7_ = auVar22._8_7_;
          auVar27._1_8_ = SUB158(auVar25 << 0x40,7);
          auVar27[0] = (char)(uVar3 >> 0x18);
          auVar27._9_6_ = 0;
          auVar26._1_10_ = SUB1510(auVar27 << 0x30,5);
          auVar26[0] = (char)(uVar3 >> 0x10);
          auVar28._11_4_ = 0;
          auVar28._0_11_ = auVar26;
          auVar23[2] = (char)(uVar3 >> 8);
          auVar23._0_2_ = (ushort)uVar3;
          auVar23._3_12_ = SUB1512(auVar28 << 0x20,3);
          auVar24._2_13_ = auVar23._2_13_;
          auVar24._0_2_ = (ushort)uVar3 & 0xff;
          auVar38._8_4_ = auVar24._0_4_;
          auVar38._12_4_ = auVar26._0_4_;
          auVar38 = pshuflw(auVar38,auVar38,0x1b);
          auVar38 = pshufhw(auVar38,auVar38,0x1b);
          sVar9 = auVar38._0_2_;
          sVar10 = auVar38._2_2_;
          sVar11 = auVar38._4_2_;
          sVar12 = auVar38._6_2_;
          sVar13 = auVar38._8_2_;
          sVar14 = auVar38._10_2_;
          sVar15 = auVar38._12_2_;
          sVar16 = auVar38._14_2_;
          *(ulong *)((long)dst + lVar35 * 8) =
               CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar38[0xe] - (0xff < sVar16),
                        CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar38[0xc] - (0xff < sVar15),
                                 CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar38[10] -
                                          (0xff < sVar14),
                                          CONCAT14((0 < sVar13) * (sVar13 < 0x100) * auVar38[8] -
                                                   (0xff < sVar13),
                                                   CONCAT13((0 < sVar12) * (sVar12 < 0x100) *
                                                            auVar38[6] - (0xff < sVar12),
                                                            CONCAT12((0 < sVar11) * (sVar11 < 0x100)
                                                                     * auVar38[4] - (0xff < sVar11),
                                                                     CONCAT11((0 < sVar10) *
                                                                              (sVar10 < 0x100) *
                                                                              auVar38[2] -
                                                                              (0xff < sVar10),
                                                                              (0 < sVar9) *
                                                                              (sVar9 < 0x100) *
                                                                              auVar38[0] -
                                                                              (0xff < sVar9))))))));
          lVar35 = lVar35 + 1;
        } while (length != lVar35);
      }
    }
  }
  return 0;
}

Assistant:

static int read_partial_array(const coda_cursor *cursor, read_function read_basic_type_function, long offset,
                              long length, uint8_t *dst, int basic_type_size)
{
    coda_cursor array_cursor;
    int i;

    array_cursor = *cursor;

    if (length > 0)
    {
        if (coda_cursor_goto_array_element_by_index(&array_cursor, offset) != 0)
        {
            return -1;
        }
        for (i = 0; i < length; i++)
        {
            if ((*read_basic_type_function)(&array_cursor, &dst[i * basic_type_size]) != 0)
            {
                return -1;
            }
            if (i < length - 1)
            {
                if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                {
                    return -1;
                }
            }
        }
    }

    return 0;
}